

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O1

Lpk_Fun_t * Lpk_FunDup(Lpk_Fun_t *p,uint *pTruth)

{
  Vec_Ptr_t *pVVar1;
  undefined8 uVar2;
  uint uVar3;
  Lpk_Fun_t *__s;
  void **ppvVar4;
  byte bVar5;
  ulong uVar6;
  uint nVars;
  int iVar7;
  
  uVar3 = *(uint *)&p->field_0x8;
  nVars = uVar3 >> 7 & 0x1f;
  bVar5 = (char)nVars - 5;
  if (nVars < 6) {
    bVar5 = 0;
  }
  __s = (Lpk_Fun_t *)malloc((0xcL << (bVar5 & 0x3f)) + 0xb0);
  memset(__s,0,0xb0);
  iVar7 = p->vNodes->nSize;
  __s->vNodes = p->vNodes;
  *(uint *)&__s->field_0x8 =
       uVar3 & 0x3fffff80 | *(uint *)&__s->field_0x8 & 0xc0000000 | (byte)iVar7 & 0xc000007f;
  uVar3 = Kit_TruthSupport(pTruth,nVars);
  __s->uSupp = uVar3;
  uVar3 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar6 = (ulong)(uint)(1 << ((char)uVar3 - 5U & 0x1f));
  if (uVar3 < 6) {
    uVar6 = 1;
  }
  memcpy(__s + 1,pTruth,uVar6 << 2);
  uVar2 = *(undefined8 *)(p->pFanins + 8);
  *(undefined8 *)__s->pFanins = *(undefined8 *)p->pFanins;
  *(undefined8 *)(__s->pFanins + 8) = uVar2;
  uVar2 = *(undefined8 *)(p->pDelays + 8);
  *(undefined8 *)__s->pDelays = *(undefined8 *)p->pDelays;
  *(undefined8 *)(__s->pDelays + 8) = uVar2;
  pVVar1 = p->vNodes;
  uVar3 = pVVar1->nCap;
  if (pVVar1->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar4;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar3 * 2;
      if (iVar7 <= (int)uVar3) goto LAB_0046ea1e;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar1->pArray,(ulong)uVar3 << 4);
      }
      pVVar1->pArray = ppvVar4;
    }
    pVVar1->nCap = iVar7;
  }
LAB_0046ea1e:
  iVar7 = pVVar1->nSize;
  pVVar1->nSize = iVar7 + 1;
  pVVar1->pArray[iVar7] = __s;
  return __s;
}

Assistant:

Lpk_Fun_t * Lpk_FunDup( Lpk_Fun_t * p, unsigned * pTruth )
{
    Lpk_Fun_t * pNew;
    pNew = Lpk_FunAlloc( p->nVars );
    pNew->Id = Vec_PtrSize(p->vNodes);
    pNew->vNodes = p->vNodes;
    pNew->nVars = p->nVars;
    pNew->nLutK = p->nLutK;
    pNew->nAreaLim = p->nAreaLim;
    pNew->nDelayLim = p->nDelayLim;
    pNew->uSupp = Kit_TruthSupport( pTruth, p->nVars );
    Kit_TruthCopy( Lpk_FunTruth(pNew,0), pTruth, p->nVars );
    memcpy( pNew->pFanins, p->pFanins, 16 );
    memcpy( pNew->pDelays, p->pDelays, 16 );
    Vec_PtrPush( p->vNodes, pNew );
    return pNew;
}